

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_api.c
# Opt level: O0

MPP_RET hal_h265d_init(void *ctx,MppHalCfg *cfg)

{
  RK_U32 RVar1;
  RockchipSocType RVar2;
  MppClientType type;
  MppDecHwCap *pMVar3;
  bool local_42;
  bool local_41;
  RK_U32 hw_id;
  RockchipSocType soc;
  RK_U32 vcodec_type;
  MppClientType client_type;
  HalH265dCtx *p;
  MPP_RET ret;
  MppHalCfg *cfg_local;
  void *ctx_local;
  
  RVar1 = mpp_get_vcodec_type();
  RVar2 = mpp_get_soc_type();
  if ((RVar1 & 0x300) == 0) {
    _mpp_log_l(2,"hal_h265d_api","Can not found valid H.265 decoder hardware on platform %08x\n",
               "hal_h265d_init",(ulong)RVar1);
    ctx_local._4_4_ = MPP_NOK;
  }
  else {
    type = VPU_CLIENT_RKVDEC;
    if ((RVar1 & 0x100) != 0) {
      type = VPU_CLIENT_HEVC_DEC;
    }
    ctx_local._4_4_ = mpp_dev_init(&cfg->dev,type);
    if (ctx_local._4_4_ == MPP_OK) {
      pMVar3 = mpp_get_dec_hw_info_by_client_type(type);
      cfg->hw_info = pMVar3;
      *(MppDecHwCap **)((long)ctx + 0x230) = cfg->hw_info;
      RVar1 = mpp_get_client_hw_id(type);
      *(MppDev *)((long)ctx + 0x10) = cfg->dev;
      local_41 = RVar2 == ROCKCHIP_SOC_RK3228H || RVar2 == ROCKCHIP_SOC_RK3328;
      *(byte *)((long)ctx + 0x1b8) = *(byte *)((long)ctx + 0x1b8) & 0xfe | local_41;
      *(byte *)((long)ctx + 0x1b8) =
           *(byte *)((long)ctx + 0x1b8) & 0xfd | (RVar1 == 0xdbdc0701) << 1;
      local_42 = RVar1 == 0x32a3f03 || RVar1 == 0x53813f05;
      *(byte *)((long)ctx + 0x1b8) = *(byte *)((long)ctx + 0x1b8) & 0xfb | local_42 << 2;
      *(byte *)((long)ctx + 0x1b8) =
           *(byte *)((long)ctx + 0x1b8) & 0xf7 | (RVar1 == 0x38321746) << 3;
      *(byte *)((long)ctx + 0x1b8) =
           *(byte *)((long)ctx + 0x1b8) & 0xef | (RVar1 == 0x38436021) << 4;
      *(MppClientType *)((long)ctx + 8) = type;
      if ((RVar1 == 0x70393f05) || (RVar1 == 0x72bb0f01)) {
        *(MppHalApi **)ctx = &hal_h265d_vdpu382;
      }
      else if ((*(byte *)((long)ctx + 0x1b8) >> 2 & 1) == 0) {
        if ((*(byte *)((long)ctx + 0x1b8) >> 3 & 1) == 0) {
          if ((*(byte *)((long)ctx + 0x1b8) >> 4 & 1) == 0) {
            *(MppHalApi **)ctx = &hal_h265d_rkv;
          }
          else {
            *(MppHalApi **)ctx = &hal_h265d_vdpu384a;
          }
        }
        else {
          *(MppHalApi **)ctx = &hal_h265d_vdpu383;
        }
      }
      else {
        *(MppHalApi **)ctx = &hal_h265d_vdpu34x;
      }
      cfg->support_fast_mode = 1;
      *(MppDecCfgSet **)((long)ctx + 0x18) = cfg->cfg;
      *(MppBufSlots *)((long)ctx + 0x20) = cfg->frame_slots;
      *(MppCbCtx **)((long)ctx + 0x188) = cfg->dec_cb;
      *(RK_U32 *)((long)ctx + 0x180) = (cfg->cfg->base).fast_parse;
      *(MppBufSlots *)((long)ctx + 0x28) = cfg->packet_slots;
      mpp_env_get_u32("hal_h265d_debug",&hal_h265d_debug,0);
      ctx_local._4_4_ = (**(code **)(*ctx + 0x18))(ctx,cfg);
    }
    else {
      _mpp_log_l(2,"hal_h265d_api","mpp_dev_init failed ret: %d\n",(char *)0x0,
                 (ulong)(uint)ctx_local._4_4_);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

MPP_RET hal_h265d_init(void *ctx, MppHalCfg *cfg)
{
    MPP_RET ret = MPP_NOK;
    HalH265dCtx *p = (HalH265dCtx *)ctx;
    MppClientType client_type = VPU_CLIENT_BUTT;
    RK_U32 vcodec_type = mpp_get_vcodec_type();
    RockchipSocType soc = mpp_get_soc_type();
    RK_U32 hw_id = 0;

    if (!(vcodec_type & (HAVE_RKVDEC | HAVE_HEVC_DEC))) {
        mpp_err_f("Can not found valid H.265 decoder hardware on platform %08x\n", vcodec_type);
        return ret;
    }

    client_type = (vcodec_type & HAVE_HEVC_DEC) ?
                  VPU_CLIENT_HEVC_DEC : VPU_CLIENT_RKVDEC;

    ret = mpp_dev_init(&cfg->dev, client_type);
    if (ret) {
        mpp_err("mpp_dev_init failed ret: %d\n", ret);
        return ret;
    }
    cfg->hw_info = mpp_get_dec_hw_info_by_client_type(client_type);
    p->hw_info = cfg->hw_info;

    hw_id = mpp_get_client_hw_id(client_type);
    p->dev = cfg->dev;
    p->is_v341 = (soc == ROCKCHIP_SOC_RK3228H || (soc == ROCKCHIP_SOC_RK3328));
    p->is_v345 = (hw_id == HWID_VDPU345);
    p->is_v34x = (hw_id == HWID_VDPU34X || hw_id == HWID_VDPU38X);
    p->is_v383 = (hw_id == HWID_VDPU383);
    p->is_v384a = (hw_id == HWID_VDPU384A);
    p->client_type = client_type;

    if (hw_id == HWID_VDPU382_RK3528 || hw_id == HWID_VDPU382_RK3562)
        p->api = &hal_h265d_vdpu382;
    else if (p->is_v34x)
        p->api = &hal_h265d_vdpu34x;
    else if (p->is_v383)
        p->api = &hal_h265d_vdpu383;
    else if (p->is_v384a)
        p->api = &hal_h265d_vdpu384a;
    else
        p->api = &hal_h265d_rkv;

    cfg->support_fast_mode = 1;

    p->cfg = cfg->cfg;
    p->slots = cfg->frame_slots;
    p->dec_cb = cfg->dec_cb;
    p->fast_mode = cfg->cfg->base.fast_parse;
    p->packet_slots = cfg->packet_slots;

    mpp_env_get_u32("hal_h265d_debug", &hal_h265d_debug, 0);

    ret = p->api->init(ctx, cfg);

    return ret;
}